

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.h
# Opt level: O0

TestAllTypes_NestedMessage * __thiscall
edition_unittest::TestAllTypes::_internal_mutable_optional_nested_message(TestAllTypes *this)

{
  Arena *arena;
  TestAllTypes_NestedMessage *pTVar1;
  TestAllTypes_NestedMessage *p;
  TestAllTypes *this_local;
  
  if ((this->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestAllTypes_NestedMessage *)
             google::protobuf::Arena::DefaultConstruct<edition_unittest::TestAllTypes_NestedMessage>
                       (arena);
    (this->field_0)._impl_.optional_nested_message_ = pTVar1;
  }
  return (this->field_0)._impl_.optional_nested_message_;
}

Assistant:

TestAllTypes::_internal_mutable_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_nested_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::edition_unittest::TestAllTypes_NestedMessage>(GetArena());
    _impl_.optional_nested_message_ = reinterpret_cast<::edition_unittest::TestAllTypes_NestedMessage*>(p);
  }
  return _impl_.optional_nested_message_;
}